

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.hh
# Opt level: O1

bool __thiscall PcodeOp::isCollapsible(PcodeOp *this)

{
  pointer ppVVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (((this->opcode->opcode != CPUI_COPY) && ((this->flags & 0x10) == 0)) &&
     (this->output != (Varnode *)0x0)) {
    ppVVar1 = (this->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar2 = (long)(this->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppVVar1;
    if (lVar2 != 0) {
      uVar3 = lVar2 >> 3;
      if (((*ppVVar1)->flags & 2) != 0) {
        uVar4 = 0;
        do {
          if ((uVar3 + (uVar3 == 0)) - 1 == uVar4) goto LAB_0026f2a8;
          lVar2 = uVar4 + 1;
          uVar4 = uVar4 + 1;
        } while ((ppVVar1[lVar2]->flags & 2) != 0);
        if (uVar3 <= uVar4) {
LAB_0026f2a8:
          return (uint)this->output->size < 9;
        }
      }
    }
  }
  return false;
}

Assistant:

bool isCommutative(void) const { return ((flags & PcodeOp::commutative)!=0); }